

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_character.cpp
# Opt level: O2

int main(void)

{
  uint64_t packed_00;
  ostream *poVar1;
  ulong uVar2;
  uint64_t packed;
  uint64_t prefix;
  uint64_t sub;
  string str;
  uint64_t local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"Hello World!",(allocator<char> *)&packed);
  packed_00 = ::packed::character::construct(&str,6);
  packed = packed_00;
  poVar1 = std::operator<<((ostream *)&std::cout,"str = ");
  poVar1 = std::operator<<(poVar1,(string *)&str);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"packed = str[6..] = ");
  print_packed(packed_00);
  poVar1 = std::operator<<((ostream *)&std::cout,"|packed| = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar2 = packed_00 >> 0x10 & 0xffffffff;
  sub = uVar2;
  std::operator<<((ostream *)&std::cout,"sub = packed[2..2+3] = ");
  print_packed(uVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"|sub| = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"lcp(packed,sub) = ");
  ::packed::character::longest_common_prefix(&packed,&sub);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"lcp(str[2..],str[9..]) = ");
  prefix = ::packed::character::construct(&str,2);
  local_10 = ::packed::character::construct(&str,9);
  ::packed::character::longest_common_prefix(&prefix,&local_10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar2 = packed & 0xffffffff;
  prefix = uVar2;
  std::operator<<((ostream *)&std::cout,"prefix = packed[1..4] = ");
  print_packed(uVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"|prefix| = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"is prefix?: ");
  ::packed::character::is_prefix(&packed,&prefix);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&str);
  return 0;
}

Assistant:

int main() {
   std::string str = "Hello World!";
   auto packed = C::construct(str, 6); // packed = str[6..]
   std::cout << "str = " << str << std::endl;
   std::cout << "packed = str[6..] = ";
   print_packed(packed);
   std::cout << "|packed| = " << static_cast<size_t>(C::char_length(packed)) << std::endl; 
   auto sub = C::substring(packed, 2,4); // sub = packed[2..2+3]
   std::cout << "sub = packed[2..2+3] = ";
   print_packed(sub); 
   std::cout << "|sub| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "lcp(packed,sub) = " << static_cast<size_t>(C::longest_common_prefix(packed, sub)) << std::endl;

   std::cout << "lcp(str[2..],str[9..]) = " << static_cast<size_t>(C::longest_common_prefix(C::construct(str,2), C::construct(str,9))) << std::endl;

   auto prefix = C::truncate(packed, 4); // prefix = packed[1..4]
   std::cout << "prefix = packed[1..4] = ";
   print_packed(prefix); 
   std::cout << "|prefix| = " << static_cast<size_t>(C::char_length(sub)) << std::endl; 
   std::cout << "is prefix?: " << C::is_prefix(packed, prefix) << std::endl; 


}